

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O1

bool __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::remove_least_element_in_tree
          (binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,node *t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r)

{
  node *pnVar1;
  
  pnVar1 = t->left;
  if (t->left == this->NIL) {
    pnVar1 = t->right;
    (&t->parent->left)[t->parent->left != t] = pnVar1;
    if (this->tree_root == t) {
      this->tree_root = pnVar1;
    }
  }
  else {
    do {
      t = pnVar1;
      pnVar1 = t->left;
    } while (t->left != this->NIL);
    pnVar1 = t->right;
    t->parent->left = pnVar1;
  }
  std::__cxx11::string::swap((string *)d);
  std::__cxx11::string::swap((string *)r);
  pnVar1->parent = t->parent;
  if (t->color == '\x01') {
    fix_after_remove(this,pnVar1);
  }
  pnVar1 = this->current_element;
  memory_manager_kernel_2<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node,_10UL>
  ::deallocate(&this->pool,t);
  return t == pnVar1;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    remove_least_element_in_tree (
        node* t,
        domain& d,
        range& r
    ) 
    {

        node* next = t->left;
        node* child;  // the child node of the one we will slice out

        if (next == NIL)
        {
            // need to determine if t is a left or right child
            if (t->parent->left == t)
                child = t->parent->left = t->right;
            else
                child = t->parent->right = t->right;

            // update tree_root if necessary
            if (t == tree_root)
                tree_root = child;
        }
        else
        {
            // find the least node
            do 
            {
                t = next;
                next = next->left;
            } while (next != NIL);
            // t is a left child
            child = t->parent->left = t->right;

        }
        
        // swap the item from this node into d and r
        exchange(d,t->d);
        exchange(r,t->r);

        // plug hole left by removing this node
        child->parent = t->parent;

        // keep the red-black properties true
        if (t->color == black)
            fix_after_remove(child);

        bool rvalue = (t == current_element);
        // free the memory for this removed node
        pool.deallocate(t);        
        return rvalue;
    }